

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuttonChenAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::SuttonChenAdapter::makeSuttonChen
          (SuttonChenAdapter *this,RealType c,RealType m,RealType n,RealType alpha,RealType epsilon)

{
  bool bVar1;
  undefined8 *in_RDI;
  AtomType *in_XMM2_Qa;
  shared_ptr<OpenMD::GenericData> *in_XMM3_Qa;
  SCAtypeParameters scParam;
  string *in_stack_ffffffffffffff58;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffff60;
  shared_ptr<OpenMD::GenericData> *this_00;
  SCAtypeParameters *in_stack_ffffffffffffff80;
  element_type *in_stack_ffffffffffffff88;
  
  bVar1 = isSuttonChen((SuttonChenAdapter *)0x37526b);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> *)&stack0xffffffffffffff88;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,std::__cxx11::string_const&,OpenMD::SCAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,void>(this_00,__r);
  AtomType::addProperty(in_XMM2_Qa,in_XMM3_Qa);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x375338);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> *)0x375342);
  return;
}

Assistant:

void SuttonChenAdapter::makeSuttonChen(RealType c, RealType m, RealType n,
                                         RealType alpha, RealType epsilon) {
    if (isSuttonChen()) { at_->removeProperty(SCtypeID); }

    SCAtypeParameters scParam {};
    scParam.c       = c;
    scParam.m       = m;
    scParam.n       = n;
    scParam.alpha   = alpha;
    scParam.epsilon = epsilon;

    at_->addProperty(std::make_shared<SCAtypeData>(SCtypeID, scParam));
  }